

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_analysis.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::cord_internal::anon_unknown_0::
AnalyzeBtree<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
          (anon_unknown_0 *this,
          CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> rep,
          RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *raw_usage)

{
  int iVar1;
  iterator ppCVar2;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *raw_usage_00;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *raw_usage_01;
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> rep_00;
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> rep_01;
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> CVar3;
  Nonnull<const_CordRep_*> local_b8;
  double local_b0;
  CordRep *edge_1;
  iterator __end4_1;
  iterator __begin4_1;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *local_80;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *__range4_1;
  double local_70;
  Nonnull<const_CordRep_*> local_68;
  CordRep *edge;
  iterator __end4;
  iterator __begin4;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *local_40;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *__range4;
  CordRepBtree *tree;
  Nonnull<const_CordRep_*> local_28;
  Nonnull<const_CordRep_*> local_20;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *raw_usage_local;
  CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> rep_local;
  
  local_28 = (Nonnull<const_CordRep_*>)rep.fraction;
  local_20 = rep.rep;
  CVar3.fraction = (double)local_28;
  CVar3.rep = (Nonnull<const_CordRep_*>)this;
  tree = (CordRepBtree *)this;
  raw_usage_local =
       (RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *)this;
  rep_local.rep = local_28;
  RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>::Add
            ((RawUsage<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0> *)local_20
             ,0x40,CVar3);
  __range4 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)
             CordRep::btree((CordRep *)raw_usage_local);
  iVar1 = CordRepBtree::height((CordRepBtree *)__range4);
  if (iVar1 < 1) {
    ___begin4_1 = CordRepBtree::Edges((CordRepBtree *)__range4);
    local_80 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)&__begin4_1;
    __end4_1 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::begin(local_80);
    ppCVar2 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::end(local_80);
    for (; __end4_1 != ppCVar2; __end4_1 = __end4_1 + 1) {
      CVar3 = CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>::Child
                        ((CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
                          *)&raw_usage_local,*__end4_1);
      local_b8 = CVar3.rep;
      local_b0 = CVar3.fraction;
      rep_01.fraction = local_b0;
      rep_01.rep = local_20;
      AnalyzeDataEdge<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
                ((anon_unknown_0 *)local_b8,rep_01,raw_usage_01);
    }
  }
  else {
    ___begin4 = CordRepBtree::Edges((CordRepBtree *)__range4);
    local_40 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)&__begin4;
    __end4 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::begin(local_40);
    edge = (CordRep *)Span<absl::lts_20250127::cord_internal::CordRep_*const>::end(local_40);
    for (; (CordRep *)__end4 != edge; __end4 = __end4 + 1) {
      local_68 = *__end4;
      ___range4_1 = CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>::
                    Child((CordRepRef<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
                           *)&raw_usage_local,local_68);
      rep_00.fraction = local_70;
      rep_00.rep = local_20;
      AnalyzeBtree<(absl::lts_20250127::cord_internal::(anonymous_namespace)::Mode)0>
                ((anon_unknown_0 *)__range4_1,rep_00,raw_usage_00);
    }
  }
  return;
}

Assistant:

void AnalyzeBtree(CordRepRef<mode> rep, RawUsage<mode>& raw_usage) {
  raw_usage.Add(sizeof(CordRepBtree), rep);
  const CordRepBtree* tree = rep.rep->btree();
  if (tree->height() > 0) {
    for (CordRep* edge : tree->Edges()) {
      AnalyzeBtree(rep.Child(edge), raw_usage);
    }
  } else {
    for (CordRep* edge : tree->Edges()) {
      AnalyzeDataEdge(rep.Child(edge), raw_usage);
    }
  }
}